

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_diag.c
# Opt level: O0

int CVDiag(void *cvode_mem)

{
  void *__ptr;
  undefined8 uVar1;
  CVodeMem in_RDI;
  CVDiagMem cvdiag_mem;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-1,0x69,"CVDiag",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_diag.c"
                   ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if ((in_RDI->cv_tempv->ops->nvcompare == (_func_void_sunrealtype_N_Vector_N_Vector *)0x0) ||
          (in_RDI->cv_tempv->ops->nvinvtest == (_func_int_N_Vector_N_Vector *)0x0)) {
    cvProcessError(in_RDI,-3,0x72,"CVDiag",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_diag.c"
                   ,"A required vector operation is not implemented.");
    local_4 = -3;
  }
  else {
    if (in_RDI->cv_lfree != (_func_int_CVodeMemRec_ptr *)0x0) {
      (*in_RDI->cv_lfree)(in_RDI);
    }
    in_RDI->cv_linit = CVDiagInit;
    in_RDI->cv_lsetup = CVDiagSetup;
    in_RDI->cv_lsolve = CVDiagSolve;
    in_RDI->cv_lfree = CVDiagFree;
    __ptr = malloc(0x30);
    if (__ptr == (void *)0x0) {
      cvProcessError(in_RDI,-4,0x84,"CVDiag",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_diag.c"
                     ,"A memory request failed.");
      local_4 = -4;
    }
    else {
      *(undefined8 *)((long)__ptr + 0x28) = 0;
      uVar1 = N_VClone(in_RDI->cv_tempv);
      *(undefined8 *)((long)__ptr + 8) = uVar1;
      if (*(long *)((long)__ptr + 8) == 0) {
        cvProcessError(in_RDI,-4,0x90,"CVDiag",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_diag.c"
                       ,"A memory request failed.");
        free(__ptr);
        local_4 = -4;
      }
      else {
        uVar1 = N_VClone(in_RDI->cv_tempv);
        *(undefined8 *)((long)__ptr + 0x10) = uVar1;
        if (*(long *)((long)__ptr + 0x10) == 0) {
          cvProcessError(in_RDI,-4,0x99,"CVDiag",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_diag.c"
                         ,"A memory request failed.");
          N_VDestroy(*(undefined8 *)((long)__ptr + 8));
          free(__ptr);
          local_4 = -4;
        }
        else {
          uVar1 = N_VClone(in_RDI->cv_tempv);
          *(undefined8 *)((long)__ptr + 0x18) = uVar1;
          if (*(long *)((long)__ptr + 0x18) == 0) {
            cvProcessError(in_RDI,-4,0xa3,"CVDiag",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_diag.c"
                           ,"A memory request failed.");
            N_VDestroy(*(undefined8 *)((long)__ptr + 8));
            N_VDestroy(*(undefined8 *)((long)__ptr + 0x10));
            free(__ptr);
            local_4 = -4;
          }
          else {
            in_RDI->cv_lmem = __ptr;
            local_4 = 0;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int CVDiag(void* cvode_mem)
{
  CVodeMem cv_mem;
  CVDiagMem cvdiag_mem;

  /* Return immediately if cvode_mem is NULL */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVDIAG_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGDG_CVMEM_NULL);
    return (CVDIAG_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Check if N_VCompare and N_VInvTest are present */
  if (vec_tmpl->ops->nvcompare == NULL || vec_tmpl->ops->nvinvtest == NULL)
  {
    cvProcessError(cv_mem, CVDIAG_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGDG_BAD_NVECTOR);
    return (CVDIAG_ILL_INPUT);
  }

  if (lfree != NULL) { lfree(cv_mem); }

  /* Set four main function fields in cv_mem */
  linit  = CVDiagInit;
  lsetup = CVDiagSetup;
  lsolve = CVDiagSolve;
  lfree  = CVDiagFree;

  /* Get memory for CVDiagMemRec */
  cvdiag_mem = NULL;
  cvdiag_mem = (CVDiagMem)malloc(sizeof(CVDiagMemRec));
  if (cvdiag_mem == NULL)
  {
    cvProcessError(cv_mem, CVDIAG_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGDG_MEM_FAIL);
    return (CVDIAG_MEM_FAIL);
  }

  last_flag = CVDIAG_SUCCESS;

  /* Allocate memory for M, bit, and bitcomp */

  M = N_VClone(vec_tmpl);
  if (M == NULL)
  {
    cvProcessError(cv_mem, CVDIAG_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGDG_MEM_FAIL);
    free(cvdiag_mem);
    cvdiag_mem = NULL;
    return (CVDIAG_MEM_FAIL);
  }
  bit = N_VClone(vec_tmpl);
  if (bit == NULL)
  {
    cvProcessError(cv_mem, CVDIAG_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGDG_MEM_FAIL);
    N_VDestroy(M);
    free(cvdiag_mem);
    cvdiag_mem = NULL;
    return (CVDIAG_MEM_FAIL);
  }
  bitcomp = N_VClone(vec_tmpl);
  if (bitcomp == NULL)
  {
    cvProcessError(cv_mem, CVDIAG_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGDG_MEM_FAIL);
    N_VDestroy(M);
    N_VDestroy(bit);
    free(cvdiag_mem);
    cvdiag_mem = NULL;
    return (CVDIAG_MEM_FAIL);
  }

  /* Attach linear solver memory to integrator memory */
  lmem = cvdiag_mem;

  return (CVDIAG_SUCCESS);
}